

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O2

void Dar_ManRefPrintStats(Ref_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int level;
  
  printf("NodesBeg = %8d. NodesEnd = %8d. Gain = %6d. (%6.2f %%).\n",
         ((double)(p->nNodesInit - (p->pAig->nObjs[6] + p->pAig->nObjs[5])) * 100.0) /
         (double)p->nNodesInit);
  uVar1 = p->nNodesTried;
  uVar2 = p->nNodesBelow;
  uVar3 = p->nNodesExten;
  uVar4 = p->nCutsUsed;
  uVar5 = Aig_ManLevels(p->pAig);
  level = 0x7570f9;
  printf("Tried = %6d. Below = %5d. Extended = %5d.  Used = %5d.  Levels = %4d.\n",(ulong)uVar1,
         (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  Abc_Print(level,"%s =","Cuts  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeCuts / 1000000.0);
  Abc_Print(level,"%s =","Eval  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeEval / 1000000.0);
  Abc_Print(level,"%s =","Other ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeOther / 1000000.0);
  Abc_Print(level,"%s =","TOTAL ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Dar_ManRefPrintStats( Ref_Man_t * p )
{
    int Gain = p->nNodesInit - Aig_ManNodeNum(p->pAig);
    printf( "NodesBeg = %8d. NodesEnd = %8d. Gain = %6d. (%6.2f %%).\n", 
        p->nNodesInit, Aig_ManNodeNum(p->pAig), Gain, 100.0*Gain/p->nNodesInit );
    printf( "Tried = %6d. Below = %5d. Extended = %5d.  Used = %5d.  Levels = %4d.\n", 
        p->nNodesTried, p->nNodesBelow, p->nNodesExten, p->nCutsUsed, Aig_ManLevels(p->pAig) );
    ABC_PRT( "Cuts  ", p->timeCuts );
    ABC_PRT( "Eval  ", p->timeEval );
    ABC_PRT( "Other ", p->timeOther );
    ABC_PRT( "TOTAL ", p->timeTotal );
}